

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_cast_helper.hpp
# Opt level: O0

Result_Type
chaiscript::detail::
Cast_Helper_Inner<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
::cast(Boxed_Value *ob,Type_Conversions_State *param_2)

{
  bool bVar1;
  Result_Type pbVar2;
  undefined8 uVar3;
  type_info *in_RDI;
  bad_any_cast *unaff_retaddr;
  
  Boxed_Value::get_type_info((Boxed_Value *)0x406af8);
  bVar1 = Type_Info::bare_equal_type_info((Type_Info *)unaff_retaddr,in_RDI);
  if (!bVar1) {
    uVar3 = __cxa_allocate_exception(0x28);
    exception::bad_any_cast::bad_any_cast(unaff_retaddr);
    __cxa_throw(uVar3,&exception::bad_any_cast::typeinfo,exception::bad_any_cast::~bad_any_cast);
  }
  pbVar2 = (Result_Type)Boxed_Value::get_const_ptr((Boxed_Value *)0x406b17);
  return pbVar2;
}

Assistant:

static Result_Type cast(const Boxed_Value &ob, const Type_Conversions_State *)
        {
          if (ob.get_type_info().bare_equal_type_info(typeid(Result)))
          {
            return static_cast<const Result *>(ob.get_const_ptr());
          } else {
            throw chaiscript::detail::exception::bad_any_cast();
          }
        }